

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_has_list_Test::~ObjectTest_basic_has_list_Test
          (ObjectTest_basic_has_list_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_has_list) {
	object obj;

	EXPECT_FALSE(obj.has<std::list<bool>>());
	EXPECT_FALSE(obj.has<std::list<signed char>>());
	EXPECT_FALSE(obj.has<std::list<unsigned char>>());
	EXPECT_FALSE(obj.has<std::list<short>>());
	EXPECT_FALSE(obj.has<std::list<int>>());
	EXPECT_FALSE(obj.has<std::list<long>>());
	EXPECT_FALSE(obj.has<std::list<long long>>());
	EXPECT_FALSE(obj.has<std::list<intmax_t>>());
	EXPECT_FALSE(obj.has<std::list<float>>());
	EXPECT_FALSE(obj.has<std::list<double>>());
	EXPECT_FALSE(obj.has<std::list<long double>>());
	EXPECT_FALSE(obj.has<std::list<std::u8string>>());
	EXPECT_FALSE(obj.has<std::list<object>>());
}